

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *poVar2;
  TestPartResult *pTVar3;
  int line;
  int width;
  int width_00;
  int width_01;
  int width_02;
  TimeInMillis ms;
  pointer pcVar4;
  char *__s;
  internal *this;
  int iVar5;
  int i;
  string location;
  string message;
  string kIndent;
  string kTestcase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  TestResult *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestcase,"testcase",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,width);
  Indent_abi_cxx11_(&location,(internal *)0x8,width_00);
  poVar2 = std::operator<<(stream,(string *)&location);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"name",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,(test_info->name_)._M_dataplus._M_p,(allocator<char> *)&local_50);
  OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"value_param",(allocator<char> *)&local_78);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,pcVar4,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"type_param",(allocator<char> *)&local_78);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,pcVar4,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"file",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,(test_info->location_).file._M_dataplus._M_p,
               (allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"line",(allocator<char> *)&message);
    OutputJsonKey(stream,&kTestcase,&location,(test_info->location_).line,&kIndent,false);
    std::__cxx11::string::~string((string *)&location);
    poVar2 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&location,(internal *)0x8,width_01);
    poVar2 = std::operator<<(poVar2,(string *)&location);
    std::operator<<(poVar2,"}");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"status",(allocator<char> *)&local_78);
    __s = "NOTRUN";
    if (test_info->should_run_ != false) {
      __s = "RUN";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,__s,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"time",(allocator<char> *)&local_78);
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&message,(internal *)(test_info->result_).elapsed_time_,ms);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,true);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"classname",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,test_case_name,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestcase,&location,&message,&kIndent,false);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&location);
    local_58 = &test_info->result_;
    TestPropertiesAsJson(&location,&test_info->result_,&kIndent);
    std::operator<<(stream,(string *)&location);
    std::__cxx11::string::~string((string *)&location);
    iVar5 = 0;
    i = 0;
    while( true ) {
      line = 0x70;
      if ((int)(((long)(test_info->result_).test_part_results_.
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(test_info->result_).test_part_results_.
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
      pTVar3 = TestResult::GetTestPartResult(local_58,i);
      if (pTVar3->type_ != kSuccess) {
        std::operator<<(stream,",\n");
        if (iVar5 == 0) {
          poVar2 = std::operator<<(stream,(string *)&kIndent);
          poVar2 = std::operator<<(poVar2,"\"");
          poVar2 = std::operator<<(poVar2,"failures");
          std::operator<<(poVar2,"\": [\n");
        }
        this = (internal *)(pTVar3->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&location,this,(char *)(ulong)(uint)pTVar3->line_number_,line);
        std::operator+(&local_50,&location,"\n");
        std::operator+(&local_78,&local_50,(pTVar3->message_)._M_dataplus._M_p);
        EscapeJson(&message,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_50);
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"  {\n");
        poVar2 = std::operator<<(poVar2,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"    \"failure\": \"");
        poVar2 = std::operator<<(poVar2,(string *)&message);
        poVar2 = std::operator<<(poVar2,"\",\n");
        poVar2 = std::operator<<(poVar2,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"    \"type\": \"\"\n");
        poVar2 = std::operator<<(poVar2,(string *)&kIndent);
        std::operator<<(poVar2,"  }");
        iVar5 = iVar5 + 1;
        std::__cxx11::string::~string((string *)&message);
        std::__cxx11::string::~string((string *)&location);
      }
      i = i + 1;
    }
    if (0 < iVar5) {
      poVar2 = std::operator<<(stream,"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"]");
    }
    poVar2 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&location,(internal *)0x8,width_02);
    poVar2 = std::operator<<(poVar2,(string *)&location);
    std::operator<<(poVar2,"}");
  }
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestcase);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}